

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O1

void AM_clearFB(AMColor *color)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  FTexture *img;
  int iVar4;
  int iVar5;
  
  bVar3 = am_drawmapback.Value != 0 && 0 < (long)mapback.texnum;
  if ((am_drawmapback.Value == 2) && ((!am_customcolors.Value || (!AMMod.defined)))) {
    bVar3 = bVar3 && am_colorset.Value == 3;
  }
  if (bVar3) {
    if ((uint)mapback.texnum < TexMan.Textures.Count) {
      img = TexMan.Textures.Array[mapback.texnum].Texture;
    }
    else {
      img = (FTexture *)0x0;
    }
    if ((img != (FTexture *)0x0) && (iVar4 = (int)mapystart, iVar4 < f_h)) {
      uVar1 = img->Width;
      uVar2 = img->Height;
      do {
        iVar5 = (int)mapxstart;
        if (iVar5 < f_w) {
          do {
            DCanvas::DrawTexture
                      ((DCanvas *)screen,img,(double)iVar5,(double)iVar4,0x400013a2,(ulong)(uint)f_h
                       ,0x4000139b,0,0x4000139c,0,0);
            iVar5 = iVar5 + (uint)uVar1;
          } while (iVar5 < f_w);
        }
        iVar4 = iVar4 + (uint)uVar2;
      } while (iVar4 < f_h);
    }
  }
  else {
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
              (screen,0,0,(ulong)(uint)f_w,(ulong)(uint)f_h,(ulong)(uint)color->Index,
               (ulong)color->RGB);
  }
  return;
}

Assistant:

void setInvalid()
	{
		Index = -1;
		RGB = -1;
	}